

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O3

bool helics::helicsBoolValue(string_view val)

{
  size_t __n;
  int iVar1;
  size_t sVar2;
  undefined1 uVar3;
  char *in_RSI;
  size_t in_RDI;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_28._M_len = in_RDI;
  local_28._M_str = in_RSI;
  sVar2 = frozen::bits::
          pmh_tables<64ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>::
          lookup<std::basic_string_view<char,std::char_traits<char>>,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>
                    ((pmh_tables<64ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>
                      *)&helicsBoolValue::knownStrings.tables_,&local_28,
                     (elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                     &helicsBoolValue::knownStrings.tables_.field_0x408);
  __n = helicsBoolValue::knownStrings.items_.data_[sVar2].first._M_len;
  uVar3 = 1;
  if (__n == local_28._M_len) {
    if (__n == 0) {
      if (sVar2 * 0x18 == 0x378) {
        return true;
      }
    }
    else {
      iVar1 = bcmp(helicsBoolValue::knownStrings.items_.data_[sVar2].first._M_str,local_28._M_str,
                   __n);
      if (sVar2 * 0x18 == 0x378 || iVar1 != 0) {
        return true;
      }
    }
    uVar3 = helicsBoolValue::knownStrings.items_.data_[sVar2].second;
  }
  return (bool)uVar3;
}

Assistant:

bool helicsBoolValue(std::string_view val)
{
    static constexpr const frozen::unordered_map<std::string_view, bool, 37> knownStrings{

        {"0", false},
        {"00", false},
        {std::string_view("\0", 1), false},
        {"0000", false},
        {std::string_view("\0\0\0\0\0\0\0\0", 8), false},
        {"1", true},
        {"false", false},
        {"true", true},
        {"on", true},
        {"off", false},
        {"ON", true},
        {"OFF", false},
        {"False", false},
        {"True", true},
        {"FALSE", false},
        {"TRUE", true},
        {"f", false},
        {"-", false},
        {"t", true},
        {"+", true},
        {"F", false},
        {"T", true},
        {"n", false},
        {"y", true},
        {"N", false},
        {"Y", true},
        {"no", false},
        {"yes", true},
        {"No", false},
        {"Yes", true},
        {"NO", false},
        {"YES", true},
        {"disable", false},
        {"enable", true},
        {"disabled", false},
        {"enabled", true},
        {"", false}};
    // all known false strings are captured in known strings so if it isn't in there it evaluates to
    // true
    const auto* res = knownStrings.find(val);
    if (res != knownStrings.end()) {
        return res->second;
    }
    return true;
}